

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_BrowsePathResult *
UA_Server_translateBrowsePathToNodeIds
          (UA_BrowsePathResult *__return_storage_ptr__,UA_Server *server,UA_BrowsePath *browsePath)

{
  UA_BrowsePathResult *result;
  UA_BrowsePath *browsePath_local;
  UA_Server *server_local;
  
  UA_BrowsePathResult_init(__return_storage_ptr__);
  translateBrowsePathToNodeIds(server,&adminSession,browsePath,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

UA_BrowsePathResult
UA_Server_translateBrowsePathToNodeIds(UA_Server *server,
                                       const UA_BrowsePath *browsePath) {
    UA_BrowsePathResult result;
    UA_BrowsePathResult_init(&result);
    UA_RCU_LOCK();
    translateBrowsePathToNodeIds(server, &adminSession, browsePath, &result);
    UA_RCU_UNLOCK();
    return result;
}